

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  int iVar1;
  byte bVar2;
  long in_RDI;
  
  do {
    if (0xffffff < (*(uint *)(in_RDI + 0x20) ^ *(int *)(in_RDI + 0x20) + *(int *)(in_RDI + 0x18))) {
      if (*(uint *)(in_RDI + 0x24) <= *(uint *)(in_RDI + 0x18)) {
        return;
      }
      *(uint *)(in_RDI + 0x18) = -*(int *)(in_RDI + 0x20) & *(int *)(in_RDI + 0x24) - 1U;
    }
    iVar1 = *(int *)(in_RDI + 0x1c);
    bVar2 = (**(code **)(*(long *)(in_RDI + 0x28) + 8))(*(undefined8 *)(in_RDI + 0x28));
    *(uint *)(in_RDI + 0x1c) = iVar1 << 8 | (uint)bVar2;
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) << 8;
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) << 8;
  } while( true );
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  while (1)
  {
    if((p->Low ^ (p->Low + p->Range)) >= kTopValue)
    {
      if(p->Range >= p->Bottom)
        break;
      else
        p->Range = ((uint32_t)(-(int32_t)p->Low)) & (p->Bottom - 1);
    }
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}